

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_equal_string
                  (char *file,wchar_t line,char *v1,char *e1,char *v2,char *e2,void *extra,
                  wchar_t utf8)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  wchar_t local_44;
  wchar_t l2;
  wchar_t l1;
  char *e2_local;
  char *v2_local;
  char *e1_local;
  char *v1_local;
  wchar_t line_local;
  char *file_local;
  
  assertion_count(file,line);
  if (v1 == v2) {
LAB_00102fac:
    file_local._4_4_ = L'\x01';
  }
  else {
    if ((v1 != (char *)0x0) && (v2 != (char *)0x0)) {
      iVar1 = strcmp(v1,v2);
      if (iVar1 == 0) goto LAB_00102fac;
    }
    failure_start(file,line,"%s != %s",e1,e2);
    sVar2 = strlen(e1);
    sVar3 = strlen(e2);
    local_44 = (wchar_t)sVar2;
    if ((wchar_t)sVar2 < (wchar_t)sVar3) {
      local_44 = (wchar_t)sVar3;
    }
    strdump(e1,v1,local_44,utf8);
    strdump(e2,v2,local_44,utf8);
    failure_finish(extra);
    file_local._4_4_ = L'\0';
  }
  return file_local._4_4_;
}

Assistant:

int
assertion_equal_string(const char *file, int line,
    const char *v1, const char *e1,
    const char *v2, const char *e2,
    void *extra, int utf8)
{
	int l1, l2;

	assertion_count(file, line);
	if (v1 == v2 || (v1 != NULL && v2 != NULL && strcmp(v1, v2) == 0))
		return (1);
	failure_start(file, line, "%s != %s", e1, e2);
	l1 = (int)strlen(e1);
	l2 = (int)strlen(e2);
	if (l1 < l2)
		l1 = l2;
	strdump(e1, v1, l1, utf8);
	strdump(e2, v2, l1, utf8);
	failure_finish(extra);
	return (0);
}